

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGString.h
# Opt level: O0

String * SGParser::StringWithVAFormat<char>
                   (String *__return_storage_ptr__,char *format,__va_list_tag *argList)

{
  int iVar1;
  long lVar2;
  char *__s;
  size_t __maxlen;
  int ilen2;
  allocator<char> local_3e;
  undefined1 local_3d;
  int local_3c;
  undefined8 uStack_38;
  int ilen;
  va_list argList2;
  __va_list_tag *argList_local;
  char *format_local;
  String *result;
  
  argList2[0].overflow_arg_area = argList->reg_save_area;
  uStack_38._0_4_ = argList->gp_offset;
  uStack_38._4_4_ = argList->fp_offset;
  argList2[0]._0_8_ = argList->overflow_arg_area;
  argList2[0].reg_save_area = argList;
  local_3c = vsnprintf((char *)0x0,0,format,&uStack_38);
  if (local_3c < 0) {
    __assert_fail("ilen >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/Kernel/SGString.h"
                  ,0x27,
                  "String SGParser::StringWithVAFormat(const CompatibleChar *, __va_list_tag *) [CompatibleChar = char]"
                 );
  }
  if (local_3c == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_3d = 0;
    lVar2 = (long)local_3c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,lVar2 + 1,'\0',&local_3e);
    std::allocator<char>::~allocator(&local_3e);
    __s = (char *)std::__cxx11::string::data();
    __maxlen = std::__cxx11::string::size();
    iVar1 = vsnprintf(__s,__maxlen,format,argList2[0].reg_save_area);
    if (iVar1 != local_3c) {
      __assert_fail("ilen2 == ilen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/Parser/Kernel/SGString.h"
                    ,0x34,
                    "String SGParser::StringWithVAFormat(const CompatibleChar *, __va_list_tag *) [CompatibleChar = char]"
                   );
    }
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline String StringWithVAFormat(const CompatibleChar* format, va_list argList) {
    static_assert(std::is_integral_v<CompatibleChar> && sizeof(CompatibleChar) == 1u,
                  "String supports only single-byte character types, e.g. char or char8_t");

    // Determine required buffer-size:
    va_list argList2;
    va_copy(argList2, argList);
    const auto ilen = std::vsnprintf(nullptr, 0u, reinterpret_cast<const char*>(format), argList2);
    SG_ASSERT(ilen >= 0);  // if this fails, vsnprintf() discovered an error - possibly format-error
    va_end(argList2);

    if (ilen == 0)
        return String{};

    // Write it:
    String result(static_cast<size_t>(ilen) + 1u, CharT{});
    static_assert(sizeof(result.front()) == 1u, "String supports only single-byte character, e.g., char or char8_t");
    [[maybe_unused]] const auto ilen2 = std::vsnprintf(reinterpret_cast<char*>(result.data()),
                                                       result.size(),
                                                       reinterpret_cast<const char*>(format),
                                                       argList);
    SG_ASSERT(ilen2 == ilen);

    result.resize(static_cast<size_t>(ilen2));
    return result;
}